

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::read_only_file_check(crunch *this,char *pDst_filename)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = crnlib::file_utils::is_read_only(in_RSI);
  if (bVar1) {
    bVar1 = crnlib::command_line_params::get_value_as_bool
                      ((command_line_params *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                       (uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    if (bVar1) {
      bVar1 = crnlib::file_utils::disable_read_only(in_RSI);
      if (bVar1) {
        crnlib::console::warning("Setting read-only file \"%s\" to writable",in_RSI);
        bVar1 = true;
      }
      else {
        crnlib::console::error("Failed setting read-only file \"%s\" to writable!",in_RSI);
        bVar1 = false;
      }
    }
    else {
      crnlib::console::error("Output file \"%s\" is read-only!",in_RSI);
      bVar1 = false;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool read_only_file_check(const char* pDst_filename) {
    if (!file_utils::is_read_only(pDst_filename))
      return true;

    if (m_params.get_value_as_bool("forcewrite")) {
      if (file_utils::disable_read_only(pDst_filename)) {
        console::warning("Setting read-only file \"%s\" to writable", pDst_filename);
        return true;
      } else {
        console::error("Failed setting read-only file \"%s\" to writable!", pDst_filename);
        return false;
      }
    }

    console::error("Output file \"%s\" is read-only!", pDst_filename);

    return false;
  }